

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O2

void signature_set(signature s,size_t index,char *name,type t)

{
  int iVar1;
  size_t sVar2;
  set __dest;
  size_t line;
  char *message;
  signature value;
  
  if (((s != (signature)0x0) && (name != (char *)0x0)) && (index < s->count)) {
    sVar2 = strlen(name);
    __dest = (set)malloc(sVar2 + 1);
    if (__dest == (set)0x0) {
      message = "Invalid signature name allocation";
      line = 0xe4;
    }
    else {
      value = s + index + 1;
      free(s[index + 1].map);
      s[index + 1].map = __dest;
      memcpy(__dest,name,sVar2 + 1);
      s[index + 1].count = (size_t)t;
      value->ret = (type)index;
      iVar1 = set_insert(s->map,__dest,value);
      if (iVar1 == 0) {
        return;
      }
      free(s[index + 1].map);
      value->ret = (type)0xffffffffffffffff;
      s[index + 1].map = (set)0x0;
      s[index + 1].count = 0;
      message = "Invalid signature set insertion";
      line = 0xfe;
    }
    log_write_impl_va("metacall",line,"signature_set",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_signature.c"
                      ,LOG_LEVEL_ERROR,message);
    return;
  }
  return;
}

Assistant:

void signature_set(signature s, size_t index, const char *name, type t)
{
	if (s != NULL && index < s->count && name != NULL)
	{
		signature_node node = signature_at(s, index);

		size_t name_size = strlen(name) + 1;

		char *name_node = malloc(sizeof(char) * name_size);

		if (name_node == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid signature name allocation");

			return;
		}

		if (node->name != NULL)
		{
			free(node->name);
		}

		node->name = name_node;

		memcpy(node->name, name, name_size);

		node->t = t;

		node->index = index;

		if (set_insert(s->map, (set_key)node->name, (set_value)node) != 0)
		{
			free(node->name);

			node->index = REFLECT_SIGNATURE_INVALID_INDEX;
			node->name = NULL;
			node->t = NULL;

			log_write("metacall", LOG_LEVEL_ERROR, "Invalid signature set insertion");
		}
	}
}